

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O3

bool __thiscall
Js::AsmJsModuleCompiler::SetupLocalVariables(AsmJsModuleCompiler *this,AsmJsFunc *func)

{
  TypedRegisterAllocator *this_00;
  uint uVar1;
  ParseNode *this_01;
  ParseNode *this_02;
  double dVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  BOOLEAN BVar6;
  Which WVar7;
  OpCode OVar8;
  int iVar9;
  Types TVar10;
  RegSlot RVar11;
  uint uVar12;
  RegSlot RVar13;
  undefined4 *puVar14;
  ParseNodeBin *pPVar15;
  ParseNodeVar *pPVar16;
  AsmJsFunctionDeclaration *sym;
  ParseNodeUni *pPVar17;
  AsmJsSymbol *sym_00;
  IdentPtr pIVar18;
  AsmJsVarBase *pAVar19;
  RegisterSpace *pRVar20;
  ParseNodeInt *pPVar21;
  RegSlot *pRVar22;
  ParseNodeFloat *pPVar23;
  ParseNodeCall *pPVar24;
  AsmJsMathConst *pAVar25;
  AsmJsVar *pAVar26;
  long lVar27;
  ulong uVar28;
  char16_t *pcVar29;
  ParseNode *this_03;
  long i64;
  long lVar30;
  PageAllocator *this_04;
  PageAllocator *pPVar31;
  bool bVar32;
  undefined4 uVar33;
  undefined1 auStack_98 [8];
  BVSparse<Memory::ArenaAllocator> initializerBV;
  PageAllocator *local_70;
  AsmJsType local_34;
  
  this_03 = func->mBodyNode;
  initializerBV.alloc = (Type)auStack_98;
  auStack_98 = (undefined1  [8])0x0;
  initializerBV.head = (Type)0x0;
  initializerBV.lastFoundIndex = (Type)this;
  if (this_03->nop == knopList) {
    this_00 = &func->mTypedRegisterAllocator;
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      pPVar15 = ParseNode::AsParseNodeBin(this_03);
      pPVar31 = (PageAllocator *)pPVar15->pnode1;
      while (pPVar31 != (PageAllocator *)0x0) {
        OVar8 = *(OpCode *)&pPVar31->_vptr_PageAllocatorBase;
        if (OVar8 == knopList) {
          pPVar15 = ParseNode::AsParseNodeBin((ParseNode *)pPVar31);
          this_04 = (PageAllocator *)pPVar15->pnode1;
          pPVar15 = ParseNode::AsParseNodeBin((ParseNode *)pPVar31);
          local_70 = (PageAllocator *)pPVar15->pnode2;
          OVar8 = *(OpCode *)&this_04->_vptr_PageAllocatorBase;
        }
        else {
          if (OVar8 == knopEndCode) break;
          local_70 = (PageAllocator *)0x0;
          this_04 = pPVar31;
        }
        bVar32 = OVar8 != knopVarDecl;
        if (bVar32) goto LAB_009490be;
        pPVar16 = ParseNode::AsParseNodeVar((ParseNode *)this_04);
        this_01 = pPVar16->pnodeInit;
        if (this_01 == (ParseNode *)0x0) {
          pcVar29 = L"The righthand side of a var declaration missing an initialization (empty)";
          goto LAB_00949129;
        }
        OVar8 = this_01->nop;
        sym_00 = (AsmJsSymbol *)0x0;
        bVar4 = false;
        if (knopImport < OVar8) {
          if (OVar8 == knopFlt) goto LAB_0094881f;
          if ((OVar8 != knopCall) ||
             (pPVar24 = ParseNode::AsParseNodeCall(this_01), pPVar24->pnodeTarget->nop != knopName))
          goto LAB_00949122;
          pPVar24 = ParseNode::AsParseNodeCall(this_01);
          pIVar18 = ParseNode::name(pPVar24->pnodeTarget);
          sym = LookupIdentifier<Js::AsmJsFunctionDeclaration>(this,pIVar18);
          if (sym == (AsmJsFunctionDeclaration *)0x0) {
            pcVar29 = L"Cannot resolve function name";
          }
          else if ((sym->super_AsmJsSymbol).mType == MathBuiltinFunction) {
            bVar4 = AsmJsMathFunction::IsFround(sym);
            if (bVar4) {
              pPVar24 = ParseNode::AsParseNodeCall(this_01);
              this_02 = pPVar24->pnodeArgs;
              if (this_02 != (ParseNode *)0x0) {
                OVar8 = this_02->nop;
                bVar4 = true;
                if ((OVar8 == knopInt) || (OVar8 == knopFlt)) {
LAB_009487d3:
                  sym_00 = (AsmJsSymbol *)0x0;
                  goto LAB_0094881f;
                }
                if ((OVar8 == knopNeg) &&
                   (pPVar17 = ParseNode::AsParseNodeUni(this_02), pPVar17->pnode1->nop == knopInt))
                {
                  pPVar17 = ParseNode::AsParseNodeUni(this_02);
                  pPVar21 = ParseNode::AsParseNodeInt(pPVar17->pnode1);
                  if (pPVar21->lw == 0) goto LAB_009487d3;
                }
              }
            }
            pcVar29 = L"Var declaration with something else than a literal value|fround call";
          }
          else {
            pcVar29 = L"Unknown function call on var declaration";
          }
          bVar32 = false;
          AsmJSCompiler::OutputError(this->mCx->scriptContext,pcVar29);
          goto LAB_009490be;
        }
        if (OVar8 == knopName) {
          pIVar18 = ParseNode::name(this_01);
          sym_00 = LookupIdentifier(this,pIVar18,func,(Source *)0x0);
          if (((sym_00 == (AsmJsSymbol *)0x0) || ((sym_00->mType & ~MathConstant) != Variable)) ||
             (iVar9 = (*sym_00->_vptr_AsmJsSymbol[1])(sym_00), (char)iVar9 != '\0')) {
            pcVar29 = L"Var declaration with non-constant";
            goto LAB_00949129;
          }
          bVar4 = false;
        }
        else if (OVar8 != knopInt) {
LAB_00949122:
          pcVar29 = L"Var declaration with something else than a literal value|fround call";
LAB_00949129:
          bVar32 = false;
          AsmJSCompiler::OutputError(this->mCx->scriptContext,pcVar29);
          goto LAB_009490be;
        }
LAB_0094881f:
        pIVar18 = ParseNode::name((ParseNode *)this_04);
        bVar5 = AsmJSCompiler::CheckIdentifier(this,(ParseNode *)this_04,pIVar18);
        if (!bVar5) goto LAB_009490be;
        pIVar18 = ParseNode::name((ParseNode *)this_04);
        pAVar19 = AsmJsFunc::DefineVar(func,pIVar18,false,true);
        if (pAVar19 == (AsmJsVarBase *)0x0) {
          pcVar29 = L"Failed to define var";
LAB_009490f5:
          bVar32 = false;
          AsmJSCompiler::OutputError(this->mCx->scriptContext,pcVar29);
          goto LAB_009490be;
        }
        BVar6 = BVSparse<Memory::ArenaAllocator>::Test
                          ((BVSparse<Memory::ArenaAllocator> *)auStack_98,
                           ((pAVar19->super_AsmJsSymbol).mName)->m_propertyId);
        if (BVar6 != '\0') {
          pcVar29 = L"Cannot declare a var after using it in an initializer";
          goto LAB_009490f5;
        }
        OVar8 = this_01->nop;
        pPVar31 = local_70;
        if (OVar8 == knopFlt) {
          pPVar23 = ParseNode::AsParseNodeFloat(this_01);
          if ((pPVar23->field_0x18 & 1) != 0) {
            pPVar23 = ParseNode::AsParseNodeFloat(this_01);
            if ((pPVar23->dbl == -2147483648.0) && (!NAN(pPVar23->dbl))) {
              AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_34,Int);
              (pAVar19->super_AsmJsSymbol).field_0x14 = (undefined1)local_34.which_;
              TVar10 = WAsmJs::FromPrimitiveType<int>();
              pRVar20 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,TVar10);
              RVar11 = WAsmJs::RegisterSpace::AcquireRegister(pRVar20);
              pAVar19->mLocation = RVar11;
              *(undefined4 *)&pAVar19[1].super_AsmJsSymbol._vptr_AsmJsSymbol = 0x80000000;
              TVar10 = WAsmJs::FromPrimitiveType<int>();
              pRVar20 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,TVar10);
              lVar30 = *(long *)&pRVar20[1].mFirstTmpReg;
              uVar12 = 0;
              if (lVar30 != 0) {
                uVar12 = JsUtil::
                         BaseDictionary<int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                         ::GetBucket(1,pRVar20[2].mNbConst,pRVar20[3].mNextLocation);
                uVar1 = *(uint *)(lVar30 + (ulong)uVar12 * 4);
                uVar12 = 0;
                if (-1 < (int)uVar1) {
                  uVar12 = 0;
                  do {
                    uVar12 = uVar12 + 1;
                    uVar1 = *(uint *)(*(long *)&pRVar20[1].mNbConst + (ulong)uVar1 * 0xc + 4);
                  } while (-1 < (int)uVar1);
                }
              }
              pRVar22 = &Constants::NoRegister;
              if (*(DictionaryStats **)&pRVar20[3].mNbConst != (DictionaryStats *)0x0) {
                DictionaryStats::Lookup(*(DictionaryStats **)&pRVar20[3].mNbConst,uVar12);
                pRVar22 = &Constants::NoRegister;
              }
              goto LAB_00948fc8;
            }
          }
          OVar8 = this_01->nop;
          if (OVar8 == knopFlt) {
            pPVar23 = ParseNode::AsParseNodeFloat(this_01);
            if ((((pPVar23->field_0x18 & 1) != 0) &&
                (pPVar23 = ParseNode::AsParseNodeFloat(this_01), 2147483647.0 < pPVar23->dbl)) &&
               (pPVar23 = ParseNode::AsParseNodeFloat(this_01), pPVar23->dbl <= 4294967295.0)) {
              AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_34,Int);
              (pAVar19->super_AsmJsSymbol).field_0x14 = (undefined1)local_34.which_;
              TVar10 = WAsmJs::FromPrimitiveType<int>();
              pRVar20 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,TVar10);
              RVar11 = WAsmJs::RegisterSpace::AcquireRegister(pRVar20);
              pAVar19->mLocation = RVar11;
              pPVar23 = ParseNode::AsParseNodeFloat(this_01);
              *(int *)&pAVar19[1].super_AsmJsSymbol._vptr_AsmJsSymbol = (int)(long)pPVar23->dbl;
              pPVar23 = ParseNode::AsParseNodeFloat(this_01);
              dVar2 = pPVar23->dbl;
              TVar10 = WAsmJs::FromPrimitiveType<int>();
              pRVar20 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,TVar10);
              lVar30 = *(long *)&pRVar20[1].mFirstTmpReg;
              uVar12 = 0;
              if (lVar30 != 0) {
                iVar9 = (int)(long)dVar2;
                uVar12 = JsUtil::
                         BaseDictionary<int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                         ::GetBucket(iVar9 * 2 + 1,pRVar20[2].mNbConst,pRVar20[3].mNextLocation);
                uVar1 = *(uint *)(lVar30 + (ulong)uVar12 * 4);
                uVar12 = 0;
                if (-1 < (int)uVar1) {
                  lVar30 = *(long *)&pRVar20[1].mNbConst;
                  uVar12 = 0;
                  do {
                    uVar28 = (ulong)uVar1;
                    lVar27 = uVar28 * 3;
                    if (*(int *)(lVar30 + 8 + uVar28 * 0xc) == iVar9) {
                      if (*(DictionaryStats **)&pRVar20[3].mNbConst == (DictionaryStats *)0x0)
                      goto LAB_00948d61;
                      DictionaryStats::Lookup(*(DictionaryStats **)&pRVar20[3].mNbConst,uVar12);
                      goto LAB_00948d5d;
                    }
                    uVar12 = uVar12 + 1;
                    uVar1 = *(uint *)(lVar30 + uVar28 * 0xc + 4);
                  } while (-1 < (int)uVar1);
                }
              }
              pRVar22 = &Constants::NoRegister;
              if (*(DictionaryStats **)&pRVar20[3].mNbConst != (DictionaryStats *)0x0) {
                DictionaryStats::Lookup(*(DictionaryStats **)&pRVar20[3].mNbConst,uVar12);
                pRVar22 = &Constants::NoRegister;
              }
              goto LAB_00948fc8;
            }
            OVar8 = this_01->nop;
          }
LAB_00948ab8:
          if (OVar8 == knopName) {
            if ((sym_00 == (AsmJsSymbol *)0x0) || (sym_00->mType != Variable)) {
              local_34.which_ = (**sym_00->_vptr_AsmJsSymbol)(sym_00);
              bVar32 = AsmJsType::operator==(&local_34,(AsmJsType)0x2);
              if (!bVar32) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar14 = 1;
                bVar32 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                             ,0x395,"(declSym->GetType() == AsmJsType::Double)",
                                             "declSym->GetType() == AsmJsType::Double");
                if (!bVar32) goto LAB_009491a3;
                *puVar14 = 0;
              }
              pAVar25 = AsmJsMathConst::FromSymbol(sym_00);
              AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_34,Double);
              (pAVar19->super_AsmJsSymbol).field_0x14 = (undefined1)local_34.which_;
              TVar10 = WAsmJs::FromPrimitiveType<double>();
              pRVar20 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,TVar10);
              RVar11 = WAsmJs::RegisterSpace::AcquireRegister(pRVar20);
              pAVar19->mLocation = RVar11;
              iVar9 = SUB84(*pAVar25->mVal,0);
              uVar33 = (undefined4)((ulong)*pAVar25->mVal >> 0x20);
LAB_00948cf2:
              pAVar19[1].super_AsmJsSymbol._vptr_AsmJsSymbol = (_func_int **)CONCAT44(uVar33,iVar9);
            }
            else {
              pAVar26 = AsmJsVar::FromSymbol(sym_00);
              BVSparse<Memory::ArenaAllocator>::Set
                        ((BVSparse<Memory::ArenaAllocator> *)auStack_98,
                         ((pAVar26->super_AsmJsVarBase).super_AsmJsSymbol.mName)->m_propertyId);
              local_34.which_._0_1_ = (pAVar26->super_AsmJsVarBase).super_AsmJsSymbol.field_0x14;
              WVar7 = AsmJsVarType::which((AsmJsVarType *)&local_34);
              if (WVar7 == Int) {
                AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_34,Int);
                (pAVar19->super_AsmJsSymbol).field_0x14 = (undefined1)local_34.which_;
                RVar13 = AsmJsFunc::AcquireRegister<int>(func);
                pAVar19->mLocation = RVar13;
                *(float *)&pAVar19[1].super_AsmJsSymbol._vptr_AsmJsSymbol =
                     (pAVar26->mConstInitialiser).floatVal;
              }
              else {
                if (WVar7 == Double) {
                  AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_34,Double);
                  (pAVar19->super_AsmJsSymbol).field_0x14 = (undefined1)local_34.which_;
                  RVar13 = AsmJsFunc::AcquireRegister<double>(func);
                  pAVar19->mLocation = RVar13;
                  iVar9 = (pAVar26->mConstInitialiser).intVal;
                  uVar33 = SUB84(pAVar26->mConstInitialiser,4);
                  goto LAB_00948cf2;
                }
                if (WVar7 != Float) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *puVar14 = 1;
                  bVar32 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                               ,0x390,"((0))","(0)");
                  goto LAB_00948d31;
                }
                AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_34,Float);
                (pAVar19->super_AsmJsSymbol).field_0x14 = (undefined1)local_34.which_;
                RVar13 = AsmJsFunc::AcquireRegister<float>(func);
                pAVar19->mLocation = RVar13;
                *(float *)&pAVar19[1].super_AsmJsSymbol._vptr_AsmJsSymbol =
                     (pAVar26->mConstInitialiser).floatVal;
              }
            }
            goto LAB_00948fd3;
          }
          if (OVar8 == knopCall) {
            if (!bVar4) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar14 = 1;
              bVar32 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                           ,0x3ba,"((0))","UNREACHED");
LAB_00948d31:
              if (bVar32 == false) {
LAB_009491a3:
                pcVar3 = (code *)invalidInstructionException();
                (*pcVar3)();
              }
              *puVar14 = 0;
              goto LAB_00948fd3;
            }
            AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_34,Float);
            (pAVar19->super_AsmJsSymbol).field_0x14 = (undefined1)local_34.which_;
            TVar10 = WAsmJs::FromPrimitiveType<float>();
            pRVar20 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,TVar10);
            RVar11 = WAsmJs::RegisterSpace::AcquireRegister(pRVar20);
            pAVar19->mLocation = RVar11;
            pPVar24 = ParseNode::AsParseNodeCall(this_01);
            if (pPVar24->pnodeArgs->nop == knopInt) {
              pPVar24 = ParseNode::AsParseNodeCall(this_01);
              pPVar21 = ParseNode::AsParseNodeInt(pPVar24->pnodeArgs);
              iVar9 = pPVar21->lw;
              *(float *)&pAVar19[1].super_AsmJsSymbol._vptr_AsmJsSymbol = (float)iVar9;
              RVar13 = AsmJsFunc::GetConstRegister<float>(func,(float)iVar9);
            }
            else {
              pPVar24 = ParseNode::AsParseNodeCall(this_01);
              bVar32 = ParserWrapper::IsNegativeZero(pPVar24->pnodeArgs);
              if (bVar32) {
                *(undefined4 *)&pAVar19[1].super_AsmJsSymbol._vptr_AsmJsSymbol = 0x80000000;
                RVar13 = AsmJsFunc::GetConstRegister<float>(func,-0.0);
              }
              else {
                pPVar24 = ParseNode::AsParseNodeCall(this_01);
                if (pPVar24->pnodeArgs->nop != knopFlt) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *puVar14 = 1;
                  bVar32 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                               ,0x3b2,
                                               "(pnodeInit->AsParseNodeCall()->pnodeArgs->nop == knopFlt)"
                                               ,
                                               "pnodeInit->AsParseNodeCall()->pnodeArgs->nop == knopFlt"
                                              );
                  if (!bVar32) goto LAB_009491a3;
                  *puVar14 = 0;
                }
                pPVar24 = ParseNode::AsParseNodeCall(this_01);
                pPVar23 = ParseNode::AsParseNodeFloat(pPVar24->pnodeArgs);
                dVar2 = pPVar23->dbl;
                *(float *)&pAVar19[1].super_AsmJsSymbol._vptr_AsmJsSymbol = (float)dVar2;
                RVar13 = AsmJsFunc::GetConstRegister<float>(func,(float)dVar2);
              }
            }
            goto LAB_00948fca;
          }
          if (OVar8 != knopFlt) goto LAB_00948fd5;
          pPVar23 = ParseNode::AsParseNodeFloat(this_01);
          if ((pPVar23->field_0x18 & 1) == 0) {
            AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_34,Double);
            (pAVar19->super_AsmJsSymbol).field_0x14 = (undefined1)local_34.which_;
            TVar10 = WAsmJs::FromPrimitiveType<double>();
            pRVar20 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,TVar10);
            RVar11 = WAsmJs::RegisterSpace::AcquireRegister(pRVar20);
            pAVar19->mLocation = RVar11;
            pPVar23 = ParseNode::AsParseNodeFloat(this_01);
            dVar2 = pPVar23->dbl;
            TVar10 = WAsmJs::FromPrimitiveType<double>();
            pRVar20 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,TVar10);
            lVar30 = *(long *)&pRVar20[1].mFirstTmpReg;
            uVar12 = 0;
            if (lVar30 != 0) {
              uVar12 = JsUtil::
                       BaseDictionary<double,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                       ::GetBucket(((uint)((ulong)dVar2 >> 0x20) ^ SUB84(dVar2,0)) * 2 + 1,
                                   pRVar20[2].mNbConst,pRVar20[3].mNextLocation);
              uVar1 = *(uint *)(lVar30 + (ulong)uVar12 * 4);
              uVar12 = 0;
              if (-1 < (int)uVar1) {
                lVar27 = *(long *)&pRVar20[1].mNbConst;
                uVar12 = 0;
                do {
                  lVar30 = (ulong)uVar1 * 0x10;
                  if (*(double *)(lVar27 + 8 + lVar30) == dVar2) {
                    if (*(DictionaryStats **)&pRVar20[3].mNbConst != (DictionaryStats *)0x0) {
                      DictionaryStats::Lookup(*(DictionaryStats **)&pRVar20[3].mNbConst,uVar12);
                      lVar27._0_4_ = pRVar20[1].mNbConst;
                      lVar27._4_4_ = pRVar20[1].mType;
                    }
                    pRVar22 = (RegSlot *)(lVar27 + lVar30);
                    goto LAB_00948e36;
                  }
                  uVar12 = uVar12 + 1;
                  uVar1 = *(uint *)(lVar30 + lVar27 + 4);
                } while (-1 < (int)uVar1);
              }
            }
            pRVar22 = &Constants::NoRegister;
            if (*(DictionaryStats **)&pRVar20[3].mNbConst != (DictionaryStats *)0x0) {
              DictionaryStats::Lookup(*(DictionaryStats **)&pRVar20[3].mNbConst,uVar12);
              pRVar22 = &Constants::NoRegister;
            }
LAB_00948e36:
            RVar13 = *pRVar22;
            pPVar23 = ParseNode::AsParseNodeFloat(this_01);
            pAVar19[1].super_AsmJsSymbol._vptr_AsmJsSymbol = (_func_int **)pPVar23->dbl;
            goto LAB_00948fca;
          }
          pcVar29 = L"Var declaration with integer literal outside range [-2^31, 2^32)";
          goto LAB_0094914e;
        }
        if (OVar8 != knopInt) goto LAB_00948ab8;
        AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_34,Int);
        (pAVar19->super_AsmJsSymbol).field_0x14 = (undefined1)local_34.which_;
        TVar10 = WAsmJs::FromPrimitiveType<int>();
        pRVar20 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,TVar10);
        RVar11 = WAsmJs::RegisterSpace::AcquireRegister(pRVar20);
        pAVar19->mLocation = RVar11;
        pPVar21 = ParseNode::AsParseNodeInt(this_01);
        *(int32 *)&pAVar19[1].super_AsmJsSymbol._vptr_AsmJsSymbol = pPVar21->lw;
        pPVar21 = ParseNode::AsParseNodeInt(this_01);
        iVar9 = pPVar21->lw;
        TVar10 = WAsmJs::FromPrimitiveType<int>();
        pRVar20 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,TVar10);
        lVar30 = *(long *)&pRVar20[1].mFirstTmpReg;
        uVar12 = 0;
        if (lVar30 != 0) {
          uVar12 = JsUtil::
                   BaseDictionary<int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   ::GetBucket(iVar9 * 2 + 1,pRVar20[2].mNbConst,pRVar20[3].mNextLocation);
          uVar1 = *(uint *)(lVar30 + (ulong)uVar12 * 4);
          uVar12 = 0;
          if (-1 < (int)uVar1) {
            lVar30 = *(long *)&pRVar20[1].mNbConst;
            uVar12 = 0;
LAB_00948927:
            uVar28 = (ulong)uVar1;
            lVar27 = uVar28 * 3;
            if (*(int *)(lVar30 + 8 + uVar28 * 0xc) != iVar9) goto code_r0x00948938;
            if (*(DictionaryStats **)&pRVar20[3].mNbConst != (DictionaryStats *)0x0) {
              DictionaryStats::Lookup(*(DictionaryStats **)&pRVar20[3].mNbConst,uVar12);
LAB_00948d5d:
              lVar30._0_4_ = pRVar20[1].mNbConst;
              lVar30._4_4_ = pRVar20[1].mType;
            }
LAB_00948d61:
            pRVar22 = (RegSlot *)(lVar30 + lVar27 * 4);
            goto LAB_00948fc8;
          }
        }
LAB_00948946:
        pRVar22 = &Constants::NoRegister;
        if (*(DictionaryStats **)&pRVar20[3].mNbConst != (DictionaryStats *)0x0) {
          DictionaryStats::Lookup(*(DictionaryStats **)&pRVar20[3].mNbConst,uVar12);
          pRVar22 = &Constants::NoRegister;
        }
LAB_00948fc8:
        RVar13 = *pRVar22;
LAB_00948fca:
        if (RVar13 == 0xffffffff) {
LAB_00948fd3:
          OVar8 = this_01->nop;
LAB_00948fd5:
          if (OVar8 != knopName) {
            pcVar29 = L"Cannot find Register constant for var";
LAB_0094914e:
            bVar32 = false;
            AsmJSCompiler::OutputError(this->mCx->scriptContext,pcVar29);
            goto LAB_009490be;
          }
        }
      }
      pPVar15 = ParseNode::AsParseNodeBin(this_03);
      if (pPVar15->pnode2->nop == knopEndCode) break;
      pPVar15 = ParseNode::AsParseNodeBin(this_03);
      this_03 = pPVar15->pnode2;
    } while (this_03->nop == knopList);
  }
  bVar32 = true;
LAB_009490be:
  BVSparse<Memory::ArenaAllocator>::~BVSparse((BVSparse<Memory::ArenaAllocator> *)auStack_98);
  return bVar32;
code_r0x00948938:
  uVar12 = uVar12 + 1;
  uVar1 = *(uint *)(lVar30 + uVar28 * 0xc + 4);
  if ((int)uVar1 < 0) goto LAB_00948946;
  goto LAB_00948927;
}

Assistant:

bool AsmJsModuleCompiler::SetupLocalVariables(AsmJsFunc * func)
    {
        ParseNodePtr pnode = func->GetBodyNode();
        MathBuiltin mathBuiltin;
        // define all variables
        BVSparse<ArenaAllocator> initializerBV(&mAllocator);
        while (pnode->nop == knopList)
        {
            ParseNode * varNode = ParserWrapper::GetBinaryLeft(pnode);
            while (varNode && varNode->nop != knopEndCode)
            {
                ParseNode * decl;
                if (varNode->nop == knopList)
                {
                    decl = ParserWrapper::GetBinaryLeft(varNode);
                    varNode = ParserWrapper::GetBinaryRight(varNode);
                }
                else
                {
                    decl = varNode;
                    varNode = nullptr;
                }
                // if we have hit a non-declaration, we are done processing the function header
                if (decl->nop != knopVarDecl)
                {
                    return true;
                }
                ParseNode* pnodeInit = decl->AsParseNodeVar()->pnodeInit;
                AsmJsSymbol * declSym = nullptr;

                bool isFroundInit = false;
                if (!pnodeInit)
                {
                    return Fail(decl, _u("The righthand side of a var declaration missing an initialization (empty)"));
                }

                if (pnodeInit->nop == knopName)
                {
                    declSym = LookupIdentifier(pnodeInit->name(), func);
                    if ((!AsmJsVar::Is(declSym) && !AsmJsMathConst::Is(declSym)) || declSym->isMutable())
                    {
                        return Fail(decl, _u("Var declaration with non-constant"));
                    }
                }
                else if (pnodeInit->nop == knopCall)
                {
                    if (pnodeInit->AsParseNodeCall()->pnodeTarget->nop != knopName)
                    {
                        return Fail(decl, _u("Var declaration with something else than a literal value|fround call"));
                    }
                    AsmJsFunctionDeclaration* funcDecl = this->LookupFunction(pnodeInit->AsParseNodeCall()->pnodeTarget->name());

                    if (!funcDecl)
                        return Fail(pnodeInit, _u("Cannot resolve function name"));

                    if (AsmJsMathFunction::Is(funcDecl))
                    {
                        if (!AsmJsMathFunction::IsFround(funcDecl) || !ParserWrapper::IsFroundNumericLiteral(pnodeInit->AsParseNodeCall()->pnodeArgs))
                        {
                            return Fail(decl, _u("Var declaration with something else than a literal value|fround call"));
                        }
                        isFroundInit = true;
                    }
                    else
                    {
                        return Fail(varNode, _u("Unknown function call on var declaration"));
                    }
                }
                else if (pnodeInit->nop != knopInt && pnodeInit->nop != knopFlt)
                {
                    return Fail(decl, _u("Var declaration with something else than a literal value|fround call"));
                }
                if (!AsmJSCompiler::CheckIdentifier(*this, decl, decl->name()))
                {
                    // CheckIdentifier will print failure message
                    return false;
                }

                AsmJsVar* var = (AsmJsVar*)func->DefineVar(decl->name(), false);
                if (!var)
                {
                    return Fail(decl, _u("Failed to define var"));
                }
                // If we are declaring a var that we previously used in an initializer, that value will be undefined
                // so we need to throw an error.
                if (initializerBV.Test(var->GetName()->GetPropertyId()))
                {
                    return Fail(decl, _u("Cannot declare a var after using it in an initializer"));
                }
                RegSlot loc = Constants::NoRegister;
                if (pnodeInit->nop == knopInt)
                {
                    var->SetVarType(AsmJsVarType::Int);
                    var->SetLocation(func->AcquireRegister<int>());
                    var->SetConstInitialiser(pnodeInit->AsParseNodeInt()->lw);
                    loc = func->GetConstRegister<int>(pnodeInit->AsParseNodeInt()->lw);
                }
                else if (ParserWrapper::IsMinInt(pnodeInit))
                {
                    var->SetVarType(AsmJsVarType::Int);
                    var->SetLocation(func->AcquireRegister<int>());
                    var->SetConstInitialiser(INT_MIN);
                    loc = func->GetConstRegister<int>(INT_MIN);
                }
                else if (ParserWrapper::IsUnsigned(pnodeInit))
                {
                    var->SetVarType(AsmJsVarType::Int);
                    var->SetLocation(func->AcquireRegister<int>());
                    var->SetConstInitialiser((int)((uint32)pnodeInit->AsParseNodeFloat()->dbl));
                    loc = func->GetConstRegister<int>((uint32)pnodeInit->AsParseNodeFloat()->dbl);
                }
                else if (pnodeInit->nop == knopFlt)
                {
                    if (pnodeInit->AsParseNodeFloat()->maybeInt)
                    {
                        return Fail(decl, _u("Var declaration with integer literal outside range [-2^31, 2^32)"));
                    }
                    var->SetVarType(AsmJsVarType::Double);
                    var->SetLocation(func->AcquireRegister<double>());
                    loc = func->GetConstRegister<double>(pnodeInit->AsParseNodeFloat()->dbl);
                    var->SetConstInitialiser(pnodeInit->AsParseNodeFloat()->dbl);
                }
                else if (pnodeInit->nop == knopName)
                {
                    if (AsmJsVar::Is(declSym))
                    {
                        AsmJsVar * definition = AsmJsVar::FromSymbol(declSym);
                        initializerBV.Set(definition->GetName()->GetPropertyId());
                        switch (definition->GetVarType().which())
                        {
                        case AsmJsVarType::Double:
                            var->SetVarType(AsmJsVarType::Double);
                            var->SetLocation(func->AcquireRegister<double>());
                            var->SetConstInitialiser(definition->GetDoubleInitialiser());
                            break;

                        case AsmJsVarType::Float:
                            var->SetVarType(AsmJsVarType::Float);
                            var->SetLocation(func->AcquireRegister<float>());
                            var->SetConstInitialiser(definition->GetFloatInitialiser());
                            break;

                        case AsmJsVarType::Int:
                            var->SetVarType(AsmJsVarType::Int);
                            var->SetLocation(func->AcquireRegister<int>());
                            var->SetConstInitialiser(definition->GetIntInitialiser());
                            break;

                        default:
                            Assume(UNREACHED);
                        }
                    }
                    else
                    {
                        Assert(declSym->GetType() == AsmJsType::Double);

                        AsmJsMathConst * definition = AsmJsMathConst::FromSymbol(declSym);

                        var->SetVarType(AsmJsVarType::Double);
                        var->SetLocation(func->AcquireRegister<double>());
                        var->SetConstInitialiser(*definition->GetVal());
                    }
                }
                else if (pnodeInit->nop == knopCall)
                {
                    if (isFroundInit)
                    {
                        var->SetVarType(AsmJsVarType::Float);
                        var->SetLocation(func->AcquireRegister<float>());
                        if (pnodeInit->AsParseNodeCall()->pnodeArgs->nop == knopInt)
                        {
                            int iVal = pnodeInit->AsParseNodeCall()->pnodeArgs->AsParseNodeInt()->lw;
                            var->SetConstInitialiser((float)iVal);
                            loc = func->GetConstRegister<float>((float)iVal);
                        }
                        else if (ParserWrapper::IsNegativeZero(pnodeInit->AsParseNodeCall()->pnodeArgs))
                        {
                            var->SetConstInitialiser(-0.0f);
                            loc = func->GetConstRegister<float>(-0.0f);
                        }
                        else
                        {
                            // note: fround((-)NumericLiteral) is explicitly allowed for any range, so we do not need to check for maybeInt
                            Assert(pnodeInit->AsParseNodeCall()->pnodeArgs->nop == knopFlt);
                            float fVal = (float)pnodeInit->AsParseNodeCall()->pnodeArgs->AsParseNodeFloat()->dbl;
                            var->SetConstInitialiser((float)fVal);
                            loc = func->GetConstRegister<float>(fVal);
                        }
                    }
                    else
                    {
                        Assert(UNREACHED);
                    }
                }

                if (loc == Constants::NoRegister && pnodeInit->nop != knopName)
                {
                    return Fail(decl, _u("Cannot find Register constant for var"));
                }
            }

            if (ParserWrapper::GetBinaryRight(pnode)->nop == knopEndCode)
            {
                break;
            }
            pnode = ParserWrapper::GetBinaryRight(pnode);
        }
        return true;
    }